

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O0

void __thiscall ncnn::InnerProduct_x86_fma::InnerProduct_x86_fma(InnerProduct_x86_fma *this)

{
  long *in_RDI;
  InnerProduct *in_stack_ffffffffffffffd8;
  
  InnerProduct::InnerProduct(in_stack_ffffffffffffffd8);
  *in_RDI = (long)&PTR_create_pipeline_01fcc908;
  in_RDI[0x14] = (long)&PTR__InnerProduct_x86_fma_01fcc988;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  in_RDI[0xf] = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)((long)in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  in_RDI[0x13] = 0;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  in_RDI[1] = 0;
  return;
}

Assistant:

InnerProduct_x86_fma::InnerProduct_x86_fma()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    flatten = 0;
}